

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  slot_type *psVar3;
  proxy *ppVar4;
  proxy *ppVar5;
  uint uVar6;
  bool bVar7;
  ushort uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i match;
  char cVar30;
  char cVar35;
  char cVar36;
  char cVar37;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar28 = hashval >> 7;
  auVar31 = ZEXT416((CONCAT11((char)hashval,(char)hashval) & 0xff7f) & 0xffff7fff);
  auVar32 = pshuflw(auVar31,auVar31,0);
  uVar27 = 0;
  auVar31 = _DAT_002be010;
  do {
    uVar28 = uVar28 & uVar2;
    pcVar1 = this->ctrl_ + uVar28;
    cVar9 = *pcVar1;
    cVar10 = pcVar1[1];
    cVar11 = pcVar1[2];
    cVar12 = pcVar1[3];
    cVar13 = pcVar1[4];
    cVar14 = pcVar1[5];
    cVar15 = pcVar1[6];
    cVar16 = pcVar1[7];
    cVar17 = pcVar1[8];
    cVar18 = pcVar1[9];
    cVar19 = pcVar1[10];
    cVar20 = pcVar1[0xb];
    cVar21 = pcVar1[0xc];
    cVar22 = pcVar1[0xd];
    cVar23 = pcVar1[0xe];
    cVar24 = pcVar1[0xf];
    cVar30 = auVar32[0];
    auVar33[0] = -(cVar30 == cVar9);
    cVar35 = auVar32[1];
    auVar33[1] = -(cVar35 == cVar10);
    cVar36 = auVar32[2];
    auVar33[2] = -(cVar36 == cVar11);
    cVar37 = auVar32[3];
    auVar33[3] = -(cVar37 == cVar12);
    auVar33[4] = -(cVar30 == cVar13);
    auVar33[5] = -(cVar35 == cVar14);
    auVar33[6] = -(cVar36 == cVar15);
    auVar33[7] = -(cVar37 == cVar16);
    auVar33[8] = -(cVar30 == cVar17);
    auVar33[9] = -(cVar35 == cVar18);
    auVar33[10] = -(cVar36 == cVar19);
    auVar33[0xb] = -(cVar37 == cVar20);
    auVar33[0xc] = -(cVar30 == cVar21);
    auVar33[0xd] = -(cVar35 == cVar22);
    auVar33[0xe] = -(cVar36 == cVar23);
    auVar33[0xf] = -(cVar37 == cVar24);
    uVar8 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    if (uVar8 != 0) {
      uVar26 = (uint)uVar8;
      do {
        uVar6 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        psVar3 = this->slots_;
        uVar29 = uVar6 + uVar28 & uVar2;
        ppVar4 = psVar3[uVar29].value.first.mDat;
        ppVar5 = (elem->first).mDat;
        if (ppVar5 == (proxy *)0x0 || ppVar4 == (proxy *)0x0) {
          if (ppVar4 == (proxy *)0x0 && ppVar5 == (proxy *)0x0) {
LAB_00223877:
            ppVar4 = (&psVar3->value)[uVar29].second.mDat;
            ppVar5 = (elem->second).mDat;
            if (ppVar5 == (proxy *)0x0 || ppVar4 == (proxy *)0x0) {
              if (ppVar4 == (proxy *)0x0 && ppVar5 == (proxy *)0x0) {
                return true;
              }
            }
            else {
              iVar25 = (*ppVar4->data->_vptr_baseHolder[4])(ppVar4->data,ppVar5->data);
              auVar31 = _DAT_002be010;
              if ((char)iVar25 != '\0') {
                return true;
              }
            }
          }
        }
        else {
          iVar25 = (*ppVar4->data->_vptr_baseHolder[4])(ppVar4->data,ppVar5->data);
          auVar31 = _DAT_002be010;
          if ((char)iVar25 != '\0') goto LAB_00223877;
        }
        uVar26 = uVar26 - 1 & uVar26;
      } while (uVar26 != 0);
    }
    auVar34[0] = -(cVar9 == auVar31[0]);
    auVar34[1] = -(cVar10 == auVar31[1]);
    auVar34[2] = -(cVar11 == auVar31[2]);
    auVar34[3] = -(cVar12 == auVar31[3]);
    auVar34[4] = -(cVar13 == auVar31[4]);
    auVar34[5] = -(cVar14 == auVar31[5]);
    auVar34[6] = -(cVar15 == auVar31[6]);
    auVar34[7] = -(cVar16 == auVar31[7]);
    auVar34[8] = -(cVar17 == auVar31[8]);
    auVar34[9] = -(cVar18 == auVar31[9]);
    auVar34[10] = -(cVar19 == auVar31[10]);
    auVar34[0xb] = -(cVar20 == auVar31[0xb]);
    auVar34[0xc] = -(cVar21 == auVar31[0xc]);
    auVar34[0xd] = -(cVar22 == auVar31[0xd]);
    auVar34[0xe] = -(cVar23 == auVar31[0xe]);
    bVar7 = cVar24 == auVar31[0xf];
    auVar34[0xf] = -bVar7;
    if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar7) {
      return false;
    }
    uVar28 = uVar28 + uVar27 + 0x10;
    uVar27 = uVar27 + 0x10;
    if (this->capacity_ <= uVar27) {
      __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x953,
                    "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::has_element(const value_type &, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                   );
    }
  } while( true );
}

Assistant:

bool has_element(const value_type& elem, size_t hashval) const
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
						                       elem))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
					seq.next();
					assert(seq.getindex() < capacity_ && "full table!");
				}
				return false;
			}